

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O2

void __thiscall PlayerA::SetSampleRate(PlayerA *this,UINT32 sampleRate)

{
  pointer ppPVar1;
  PlayerBase *pPVar2;
  uint uVar3;
  PlayerBase *pPVar4;
  size_t curPlr;
  ulong uVar5;
  
  this->_smplRate = sampleRate;
  uVar5 = 0;
  do {
    ppPVar1 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_avbPlrs).
                      super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar5) {
      return;
    }
    pPVar4 = ppPVar1[uVar5];
    pPVar2 = this->_player;
    if (pPVar4 == pPVar2) {
      uVar3 = (*pPVar2->_vptr_PlayerBase[0x19])(pPVar2);
      if ((uVar3 & 1) == 0) {
        pPVar4 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar5];
        goto LAB_0011d9a9;
      }
    }
    else {
LAB_0011d9a9:
      (*pPVar4->_vptr_PlayerBase[0xf])(pPVar4,(ulong)this->_smplRate);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void PlayerA::SetSampleRate(UINT32 sampleRate)
{
	_smplRate = sampleRate;
	for (size_t curPlr = 0; curPlr < _avbPlrs.size(); curPlr++)
	{
		if (_avbPlrs[curPlr] == _player && (_player->GetState() & PLAYSTATE_PLAY))
			continue;
		_avbPlrs[curPlr]->SetSampleRate(_smplRate);
	}
	return;
}